

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::is1DTrilinearFilterResultValid
               (LookupPrecision *prec,ColorLine *line0,ColorLine *line1,Vec2 *xBounds0,
               Vec2 *xBounds1,Vec2 *zBounds,float searchStep,Vec4 *result)

{
  float fVar1;
  bool bVar2;
  float fVar3;
  float fVar4;
  Vector<float,_4> local_b4;
  Vector<float,_4> local_a4;
  undefined1 local_94 [8];
  Vec4 c1;
  float a1;
  float x1;
  Vector<float,_4> local_6c;
  undefined1 local_5c [8];
  Vec4 c0;
  float a0;
  float x0;
  float searchStep_local;
  Vec2 *zBounds_local;
  Vec2 *xBounds1_local;
  Vec2 *xBounds0_local;
  ColorLine *line1_local;
  ColorLine *line0_local;
  LookupPrecision *prec_local;
  
  bVar2 = isInColorBounds(prec,line0,line1,result);
  if (bVar2) {
    for (c0.m_data[3] = Vector<float,_2>::x(xBounds0); fVar4 = c0.m_data[3],
        fVar3 = Vector<float,_2>::y(xBounds0), fVar1 = c0.m_data[3], fVar4 < fVar3 + searchStep;
        c0.m_data[3] = searchStep + c0.m_data[3]) {
      fVar4 = Vector<float,_2>::y(xBounds0);
      c0.m_data[2] = de::min<float>(fVar1,fVar4);
      operator*((tcu *)&local_6c,&line0->p0,1.0 - c0.m_data[2]);
      operator*((tcu *)&a1,&line0->p1,c0.m_data[2]);
      operator+((tcu *)local_5c,&local_6c,(Vector<float,_4> *)&a1);
      for (c1.m_data[3] = Vector<float,_2>::x(xBounds1); fVar4 = c1.m_data[3],
          fVar3 = Vector<float,_2>::y(xBounds1), fVar1 = c1.m_data[3], fVar4 <= fVar3;
          c1.m_data[3] = searchStep + c1.m_data[3]) {
        fVar4 = Vector<float,_2>::y(xBounds1);
        c1.m_data[2] = de::min<float>(fVar1,fVar4);
        operator*((tcu *)&local_a4,&line1->p0,1.0 - c1.m_data[2]);
        operator*((tcu *)&local_b4,&line1->p1,c1.m_data[2]);
        operator+((tcu *)local_94,&local_a4,&local_b4);
        bVar2 = isLinearRangeValid(prec,(Vec4 *)local_5c,(Vec4 *)local_94,zBounds,result);
        if (bVar2) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

static bool is1DTrilinearFilterResultValid (const LookupPrecision&	prec,
											const ColorLine&		line0,
											const ColorLine&		line1,
											const Vec2&				xBounds0,
											const Vec2&				xBounds1,
											const Vec2&				zBounds,
											const float				searchStep,
											const Vec4&				result)
{
	DE_ASSERT(xBounds0.x() <= xBounds0.y());
	DE_ASSERT(xBounds1.x() <= xBounds1.y());
	DE_ASSERT(xBounds0.x() + searchStep > xBounds0.x()); // step is not effectively 0
	DE_ASSERT(xBounds0.y() + searchStep > xBounds0.y());
	DE_ASSERT(xBounds1.x() + searchStep > xBounds1.x());
	DE_ASSERT(xBounds1.y() + searchStep > xBounds1.y());

	if (!isInColorBounds(prec, line0, line1, result))
		return false;

	for (float x0 = xBounds0.x(); x0 < xBounds0.y()+searchStep; x0 += searchStep)
	{
		const float		a0	= de::min(x0, xBounds0.y());
		const Vec4		c0	= line0.p0*(1.0f-a0) + line0.p1*a0;

		for (float x1 = xBounds1.x(); x1 <= xBounds1.y(); x1 += searchStep)
		{
			const float		a1	= de::min(x1, xBounds1.y());
			const Vec4		c1	= line1.p0*(1.0f-a1) + line1.p1*a1;

			if (isLinearRangeValid(prec, c0, c1, zBounds, result))
				return true;
		}
	}

	return false;
}